

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompositeDeepScanLine.cpp
# Opt level: O2

void __thiscall
Imf_2_5::CompositeDeepScanLine::readPixels(CompositeDeepScanLine *this,int start,int end)

{
  int *piVar1;
  long *plVar2;
  pointer ppDVar3;
  pointer ppDVar4;
  pointer puVar5;
  Header *pHVar6;
  ulong uVar7;
  Data *pDVar8;
  Task *this_00;
  size_t pixel;
  size_type sVar9;
  size_t j_1;
  long lVar10;
  int iVar11;
  size_t channel;
  pointer pvVar12;
  ulong uVar13;
  ulong uVar14;
  Header *in_R8;
  ulong uVar15;
  size_type __n;
  size_t j;
  ulong uVar16;
  long lVar17;
  bool bVar18;
  TaskGroup g;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  samples;
  vector<const_char_*,_std::allocator<const_char_*>_> names;
  vector<unsigned_int,_std::allocator<unsigned_int>_> total_sizes;
  vector<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
  pointers;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  counts;
  vector<unsigned_int,_std::allocator<unsigned_int>_> num_sources;
  vector<const_Imf_2_5::Header_*,_std::allocator<const_Imf_2_5::Header_*>_> headers;
  vector<Imf_2_5::DeepFrameBuffer,_std::allocator<Imf_2_5::DeepFrameBuffer>_> framebuffers;
  
  pDVar8 = this->_Data;
  uVar15 = ((long)(pDVar8->_part).
                  super__Vector_base<Imf_2_5::DeepScanLineInputPart_*,_std::allocator<Imf_2_5::DeepScanLineInputPart_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(pDVar8->_part).
                  super__Vector_base<Imf_2_5::DeepScanLineInputPart_*,_std::allocator<Imf_2_5::DeepScanLineInputPart_*>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) +
           ((long)(pDVar8->_file).
                  super__Vector_base<Imf_2_5::DeepScanLineInputFile_*,_std::allocator<Imf_2_5::DeepScanLineInputFile_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(pDVar8->_file).
                  super__Vector_base<Imf_2_5::DeepScanLineInputFile_*,_std::allocator<Imf_2_5::DeepScanLineInputFile_*>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3);
  std::vector<Imf_2_5::DeepFrameBuffer,_std::allocator<Imf_2_5::DeepFrameBuffer>_>::vector
            (&framebuffers,uVar15,(allocator_type *)&counts);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&counts,uVar15,(allocator_type *)&pointers);
  std::
  vector<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
  ::vector(&pointers,uVar15,(allocator_type *)&headers);
  std::vector<const_Imf_2_5::Header_*,_std::allocator<const_Imf_2_5::Header_*>_>::vector
            (&headers,uVar15,(allocator_type *)&total_sizes);
  lVar10 = 0;
  uVar16 = 0;
  while( true ) {
    pDVar8 = this->_Data;
    ppDVar3 = (pDVar8->_file).
              super__Vector_base<Imf_2_5::DeepScanLineInputFile_*,_std::allocator<Imf_2_5::DeepScanLineInputFile_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(pDVar8->_file).
                      super__Vector_base<Imf_2_5::DeepScanLineInputFile_*,_std::allocator<Imf_2_5::DeepScanLineInputFile_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppDVar3 >> 3) <= uVar16)
    break;
    pHVar6 = DeepScanLineInputFile::header(*(DeepScanLineInputFile **)((long)ppDVar3 + lVar10));
    *(Header **)
     ((long)headers.
            super__Vector_base<const_Imf_2_5::Header_*,_std::allocator<const_Imf_2_5::Header_*>_>.
            _M_impl.super__Vector_impl_data._M_start + lVar10) = pHVar6;
    uVar16 = uVar16 + 1;
    lVar10 = lVar10 + 8;
  }
  for (uVar16 = 0;
      ppDVar4 = (pDVar8->_part).
                super__Vector_base<Imf_2_5::DeepScanLineInputPart_*,_std::allocator<Imf_2_5::DeepScanLineInputPart_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar16 < (ulong)((long)(pDVar8->_part).
                             super__Vector_base<Imf_2_5::DeepScanLineInputPart_*,_std::allocator<Imf_2_5::DeepScanLineInputPart_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppDVar4 >> 3);
      uVar16 = uVar16 + 1) {
    pHVar6 = DeepScanLineInputPart::header(ppDVar4[uVar16]);
    *(Header **)
     ((long)headers.
            super__Vector_base<const_Imf_2_5::Header_*,_std::allocator<const_Imf_2_5::Header_*>_>.
            _M_impl.super__Vector_impl_data._M_start + lVar10) = pHVar6;
    pDVar8 = this->_Data;
    lVar10 = lVar10 + 8;
  }
  lVar10 = 0;
  lVar17 = 0;
  uVar16 = uVar15;
  while (bVar18 = uVar16 != 0, uVar16 = uVar16 - 1, bVar18) {
    Data::handleDeepFrameBuffer
              (this->_Data,
               (DeepFrameBuffer *)
               (&((framebuffers.
                   super__Vector_base<Imf_2_5::DeepFrameBuffer,_std::allocator<Imf_2_5::DeepFrameBuffer>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_map)._M_t._M_impl.field_0x0 + lVar10
               ),(vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 ((long)&((counts.
                           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar17),
               (vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
                *)((long)&((pointers.
                            super__Vector_base<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super__Vector_base<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + lVar17),in_R8,start,end);
    lVar17 = lVar17 + 0x18;
    lVar10 = lVar10 + 0x68;
  }
  lVar10 = 0;
  uVar16 = 0;
  while( true ) {
    pDVar8 = this->_Data;
    ppDVar3 = (pDVar8->_file).
              super__Vector_base<Imf_2_5::DeepScanLineInputFile_*,_std::allocator<Imf_2_5::DeepScanLineInputFile_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(pDVar8->_file).
                      super__Vector_base<Imf_2_5::DeepScanLineInputFile_*,_std::allocator<Imf_2_5::DeepScanLineInputFile_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppDVar3 >> 3) <= uVar16)
    break;
    DeepScanLineInputFile::setFrameBuffer
              (ppDVar3[uVar16],
               (DeepFrameBuffer *)
               (&((framebuffers.
                   super__Vector_base<Imf_2_5::DeepFrameBuffer,_std::allocator<Imf_2_5::DeepFrameBuffer>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_map)._M_t._M_impl.field_0x0 + lVar10
               ));
    DeepScanLineInputFile::readPixelSampleCounts
              ((this->_Data->_file).
               super__Vector_base<Imf_2_5::DeepScanLineInputFile_*,_std::allocator<Imf_2_5::DeepScanLineInputFile_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar16],start,end);
    uVar16 = uVar16 + 1;
    lVar10 = lVar10 + 0x68;
  }
  for (uVar16 = 0;
      ppDVar4 = (pDVar8->_part).
                super__Vector_base<Imf_2_5::DeepScanLineInputPart_*,_std::allocator<Imf_2_5::DeepScanLineInputPart_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar16 < (ulong)((long)(pDVar8->_part).
                             super__Vector_base<Imf_2_5::DeepScanLineInputPart_*,_std::allocator<Imf_2_5::DeepScanLineInputPart_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppDVar4 >> 3);
      uVar16 = uVar16 + 1) {
    DeepScanLineInputPart::setFrameBuffer
              (ppDVar4[uVar16],
               (DeepFrameBuffer *)
               (&((framebuffers.
                   super__Vector_base<Imf_2_5::DeepFrameBuffer,_std::allocator<Imf_2_5::DeepFrameBuffer>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_map)._M_t._M_impl.field_0x0 + lVar10
               ));
    DeepScanLineInputPart::readPixelSampleCounts
              ((this->_Data->_part).
               super__Vector_base<Imf_2_5::DeepScanLineInputPart_*,_std::allocator<Imf_2_5::DeepScanLineInputPart_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar16],start,end);
    pDVar8 = this->_Data;
    lVar10 = lVar10 + 0x68;
  }
  Imath_2_5::Box<Imath_2_5::Vec2<int>_>::size((Box<Imath_2_5::Vec2<int>_> *)&total_sizes);
  __n = (long)((end - start) + 1) *
        ((long)(int)total_sizes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start + 1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&total_sizes,__n,(allocator_type *)&num_sources);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&num_sources,__n,(allocator_type *)&samples);
  lVar10 = CONCAT44(total_sizes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start._4_4_,
                    (int)total_sizes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_start);
  uVar16 = 0;
  for (sVar9 = 0; sVar9 != __n; sVar9 = sVar9 + 1) {
    *(undefined4 *)(lVar10 + sVar9 * 4) = 0;
    num_sources.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[sVar9] = 0;
    pvVar12 = counts.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar14 = uVar15;
    while (bVar18 = uVar14 != 0, uVar14 = uVar14 - 1, bVar18) {
      puVar5 = (pvVar12->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      piVar1 = (int *)(lVar10 + sVar9 * 4);
      *piVar1 = *piVar1 + puVar5[sVar9];
      if (puVar5[sVar9] != 0) {
        num_sources.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[sVar9] =
             num_sources.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[sVar9] + 1;
      }
      pvVar12 = pvVar12 + 1;
    }
    uVar16 = uVar16 + *(uint *)(lVar10 + sVar9 * 4);
  }
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::vector(&samples,(long)(this->_Data->_channels).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->_Data->_channels).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)&names);
  lVar10 = 0;
  for (uVar14 = 0; pDVar8 = this->_Data,
      uVar14 < (ulong)((long)(pDVar8->_channels).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pDVar8->_channels).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5); uVar14 = uVar14 + 1) {
    if ((uVar14 != 1) || (pDVar8->_zback == true)) {
      std::vector<float,_std::allocator<float>_>::resize
                ((vector<float,_std::allocator<float>_> *)
                 ((long)&((samples.
                           super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar10),uVar16);
    }
    lVar10 = lVar10 + 0x18;
  }
  uVar14 = 0;
  while( true ) {
    if ((ulong)(((long)samples.
                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)samples.
                      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= uVar14) break;
    if ((uVar14 != 1) || (this->_Data->_zback == true)) {
      std::vector<float,_std::allocator<float>_>::resize
                (samples.
                 super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar14,uVar16);
      uVar7 = 0;
      for (sVar9 = 0; sVar9 != __n; sVar9 = sVar9 + 1) {
        lVar10 = 0;
        uVar13 = 0;
        for (; (uVar13 < uVar15 && (uVar7 < uVar16)); uVar7 = uVar7 + *(uint *)(*plVar2 + sVar9 * 4)
            ) {
          *(pointer *)
           (*(long *)(*(long *)((long)&((pointers.
                                         super__Vector_base<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super__Vector_base<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start + lVar10) +
                     uVar14 * 0x18) + sVar9 * 8) =
               samples.
               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar14].
               super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
               _M_start + uVar7;
          plVar2 = (long *)((long)&((counts.
                                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                   _M_impl.super__Vector_impl_data._M_start + lVar10);
          uVar13 = uVar13 + 1;
          lVar10 = lVar10 + 0x18;
        }
      }
    }
    uVar14 = uVar14 + 1;
  }
  uVar15 = 0;
  while( true ) {
    pDVar8 = this->_Data;
    ppDVar3 = (pDVar8->_file).
              super__Vector_base<Imf_2_5::DeepScanLineInputFile_*,_std::allocator<Imf_2_5::DeepScanLineInputFile_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(pDVar8->_file).
                      super__Vector_base<Imf_2_5::DeepScanLineInputFile_*,_std::allocator<Imf_2_5::DeepScanLineInputFile_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppDVar3 >> 3) <= uVar15)
    break;
    DeepScanLineInputFile::readPixels(ppDVar3[uVar15],start,end);
    uVar15 = uVar15 + 1;
  }
  for (uVar15 = 0;
      ppDVar4 = (pDVar8->_part).
                super__Vector_base<Imf_2_5::DeepScanLineInputPart_*,_std::allocator<Imf_2_5::DeepScanLineInputPart_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar15 < (ulong)((long)(pDVar8->_part).
                             super__Vector_base<Imf_2_5::DeepScanLineInputPart_*,_std::allocator<Imf_2_5::DeepScanLineInputPart_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppDVar4 >> 3);
      uVar15 = uVar15 + 1) {
    DeepScanLineInputPart::readPixels(ppDVar4[uVar15],start,end);
    pDVar8 = this->_Data;
  }
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            (&names,(long)(pDVar8->_channels).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pDVar8->_channels).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)&g);
  lVar10 = 0;
  uVar15 = 0;
  while( true ) {
    if ((ulong)((long)names.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)names.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) <= uVar15) break;
    *(undefined8 *)
     ((long)names.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start + lVar10) =
         *(undefined8 *)
          ((long)&(((this->_Data->_channels).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar10 * 4);
    uVar15 = uVar15 + 1;
    lVar10 = lVar10 + 8;
  }
  if (this->_Data->_zback == false) {
    names.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_start[1] =
         *names.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_start;
  }
  IlmThread_2_5::TaskGroup::TaskGroup(&g);
  for (iVar11 = start; iVar11 <= end; iVar11 = iVar11 + 1) {
    this_00 = (Task *)operator_new(0x40);
    pDVar8 = this->_Data;
    IlmThread_2_5::Task::Task(this_00,&g);
    *(undefined ***)this_00 = &PTR__Task_00421ba8;
    *(Data **)(this_00 + 0x10) = pDVar8;
    *(int *)(this_00 + 0x18) = iVar11;
    *(int *)(this_00 + 0x1c) = start;
    *(vector<const_char_*,_std::allocator<const_char_*>_> **)(this_00 + 0x20) = &names;
    *(vector<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
      **)(this_00 + 0x28) = &pointers;
    *(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(this_00 + 0x30) = &total_sizes;
    *(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(this_00 + 0x38) = &num_sources;
    IlmThread_2_5::ThreadPool::addGlobalTask(this_00);
  }
  IlmThread_2_5::TaskGroup::~TaskGroup(&g);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            (&names.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&samples);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&num_sources.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&total_sizes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<const_Imf_2_5::Header_*,_std::allocator<const_Imf_2_5::Header_*>_>::
  ~_Vector_base(&headers.
                 super__Vector_base<const_Imf_2_5::Header_*,_std::allocator<const_Imf_2_5::Header_*>_>
               );
  std::
  vector<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
  ::~vector(&pointers);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&counts);
  std::vector<Imf_2_5::DeepFrameBuffer,_std::allocator<Imf_2_5::DeepFrameBuffer>_>::~vector
            (&framebuffers);
  return;
}

Assistant:

void
CompositeDeepScanLine::readPixels(int start, int end)
{
   size_t parts = _Data->_file.size() + _Data->_part.size(); // total of files+parts
   
   vector<DeepFrameBuffer> framebuffers(parts);
   vector< vector<unsigned int> > counts(parts);
   
   //
   // for each part, a pointer to an array of channels
   //
   vector<vector< vector<float *> > > pointers(parts);
   vector<const Header *> headers(parts);
   
   {
     size_t i;
     for(i=0;i<_Data->_file.size();i++)
     {
         headers[i] = &_Data->_file[i]->header();
     }
     
     for(size_t j=0;j<_Data->_part.size();j++)
     {
        headers[i+j] = &_Data->_part[j]->header();
     }
   }
   
   
   for(size_t i=0;i<parts;i++)
   {
     _Data->handleDeepFrameBuffer(framebuffers[i],counts[i],pointers[i],*headers[i],start,end);
   }
   
   //
   // set frame buffers and read scanlines from all parts
   // TODO what happens if SCANLINE not in data window?
   //
   
   {
       size_t i=0;
       for(i=0;i<_Data->_file.size();i++)
       {
            _Data->_file[i]->setFrameBuffer(framebuffers[i]);
            _Data->_file[i]->readPixelSampleCounts(start,end);
       }
       for(size_t j=0;j<_Data->_part.size();j++)
       {
           _Data->_part[j]->setFrameBuffer(framebuffers[i+j]);
           _Data->_part[j]->readPixelSampleCounts(start,end); 
       }
   }   
   
   
   //
   //  total width
   //
   
   size_t total_width = _Data->_dataWindow.size().x+1;
   size_t total_pixels = total_width*(end-start+1);
   vector<unsigned int> total_sizes(total_pixels);
   vector<unsigned int> num_sources(total_pixels); //number of parts with non-zero sample count
   
   size_t overall_sample_count=0; // sum of all samples in all images between start and end
   
   
   //
   // accumulate pixel counts
   //
   for(size_t ptr=0;ptr<total_pixels;ptr++)
   {
       total_sizes[ptr]=0;
       num_sources[ptr]=0;
       for(size_t j=0;j<parts;j++)
       {
          total_sizes[ptr]+=counts[j][ptr];
          if(counts[j][ptr]>0) num_sources[ptr]++;
       }
       overall_sample_count+=total_sizes[ptr];
       
       
       
   }
   
  
  
   
   //
   // allocate arrays for pixel data
   // samples array accessed as in pixels[channel][sample]
   //
   
   vector<vector<float> > samples( _Data->_channels.size() );
   
   for(size_t channel=0;channel<_Data->_channels.size();channel++)
   {
       if( channel!=1 || _Data->_zback)
       {            
           samples[channel].resize(overall_sample_count);
       }
   }
   
   for(size_t channel=0;channel<samples.size();channel++)
   {
       
       if( channel!=1 || _Data->_zback)
       {
           
           samples[channel].resize(overall_sample_count);
       
       
          //
          // allocate pointers for channel data
          //
          
          size_t offset=0;
       
          for(size_t pixel=0;pixel<total_pixels;pixel++)
          {
              for(size_t part=0 ; part<parts && offset<overall_sample_count ; part++ )
              {
                      pointers[part][channel][pixel]=&samples[channel][offset];           
                      offset+=counts[part][pixel];
              }
          }
       
       }
   }
   
   //
   // read data
   //
   
   for(size_t i=0;i<_Data->_file.size();i++)
   {
       _Data->_file[i]->readPixels(start,end);
   }
   for(size_t j=0;j<_Data->_part.size();j++)
   {
       _Data->_part[j]->readPixels(start,end); 
   }
   
   
   
   
   //
   // composite pixels and write back to framebuffer
  //
   
   
   // turn vector of strings into array of char *
   // and make sure 'ZBack' channel is correct
   vector<const char *> names(_Data->_channels.size());
   for(size_t i=0;i<names.size();i++)
   {
       names[i]=_Data->_channels[i].c_str();
   }
   
   if(!_Data->_zback) names[1]=names[0]; // no zback channel, so make it point to z

   
   
   TaskGroup g;
   for(int y=start;y<=end;y++)
   {
       ThreadPool::addGlobalTask(new LineCompositeTask(&g,_Data,y,start,&names,&pointers,&total_sizes,&num_sources));
   }//next row
}